

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O0

optional<pbrt::ShapeSample> * __thiscall pbrt::Cylinder::Sample(Cylinder *this,Point2f *u)

{
  undefined1 auVar1 [16];
  Tuple2<pbrt::Point2,_float> *in_RDX;
  Cylinder *in_RSI;
  optional<pbrt::ShapeSample> *in_RDI;
  float fVar2;
  Float FVar3;
  double dVar4;
  undefined8 uVar8;
  undefined1 auVar9 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  Vector3<float> VVar10;
  Normal3<float> NVar11;
  Normal3f n;
  Point3fi pi;
  Vector3f pObjError;
  Float hitRad;
  Point3f pObj;
  Float phi;
  Float z;
  Point3fi *in_stack_000002d8;
  Transform *in_stack_000002e0;
  float in_stack_fffffffffffffe18;
  float in_stack_fffffffffffffe1c;
  Normal3<float> *in_stack_fffffffffffffe20;
  optional<pbrt::ShapeSample> *this_00;
  Float time;
  optional<pbrt::ShapeSample> *t;
  undefined4 in_stack_fffffffffffffe38;
  Float FVar12;
  optional<pbrt::ShapeSample> local_150;
  float local_f0;
  undefined8 local_e8;
  float local_e0;
  Normal3<float> *in_stack_ffffffffffffff28;
  Transform *in_stack_ffffffffffffff30;
  Tuple3<pbrt::Normal3,float> local_bc [8];
  float local_b4;
  undefined8 local_80;
  float local_78;
  undefined8 local_70;
  float local_68;
  undefined8 local_50;
  float local_48;
  undefined8 local_40;
  float local_38;
  float local_30;
  float local_2c;
  float local_28;
  float local_20;
  Float local_1c;
  Tuple2<pbrt::Point2,_float> *local_18;
  
  t = in_RDI;
  local_18 = in_RDX;
  fVar2 = Tuple2<pbrt::Point2,_float>::operator[](in_RDX,0);
  time = (Float)((ulong)in_RDI >> 0x20);
  local_1c = Lerp(fVar2,in_RSI->zMin,in_RSI->zMax);
  local_20 = Tuple2<pbrt::Point2,_float>::operator[](local_18,1);
  local_20 = local_20 * in_RSI->phiMax;
  FVar3 = in_RSI->radius;
  dVar4 = std::cos((double)(ulong)(uint)local_20);
  fVar2 = FVar3 * SUB84(dVar4,0);
  FVar12 = in_RSI->radius;
  std::sin((double)(ulong)(uint)local_20);
  Point3<float>::Point3
            ((Point3<float> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,
             in_stack_fffffffffffffe18,0.0);
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_2c),ZEXT416((uint)local_2c),
                           ZEXT416((uint)(local_28 * local_28)));
  dVar4 = std::sqrt(auVar1._0_8_);
  local_30 = SUB84(dVar4,0);
  local_2c = local_2c * (in_RSI->radius / local_30);
  local_28 = local_28 * (in_RSI->radius / local_30);
  pbrt::gamma((double)(ulong)(uint)local_28);
  uVar8 = 0;
  Vector3<float>::Vector3
            ((Vector3<float> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,
             in_stack_fffffffffffffe18,0.0);
  VVar10 = Abs<pbrt::Vector3,float>((Tuple3<pbrt::Vector3,_float> *)t);
  local_68 = VVar10.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar9 = (undefined1  [56])0x0;
  auVar1._8_8_ = uVar8;
  auVar1._0_8_ = VVar10.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_70 = vmovlpd_avx(auVar1);
  local_50 = local_70;
  local_48 = local_68;
  VVar10 = pbrt::operator*(fVar2,(Tuple3<pbrt::Vector3,_float> *)
                                 CONCAT44(FVar3,in_stack_fffffffffffffe38));
  local_78 = VVar10.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar5._0_8_ = VVar10.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar5._8_56_ = auVar9;
  local_80 = vmovlpd_avx(auVar5._0_16_);
  local_40 = local_80;
  local_38 = local_78;
  Point3fi::Point3fi((Point3fi *)CONCAT44(fVar2,FVar12),
                     (Point3f *)CONCAT44(FVar3,in_stack_fffffffffffffe38),(Vector3f *)t);
  Transform::operator()(in_stack_000002e0,in_stack_000002d8);
  auVar9 = (undefined1  [56])0x0;
  Normal3<float>::Normal3
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18,0.0);
  NVar11 = Transform::operator()(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  local_e0 = NVar11.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar6._0_8_ = NVar11.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar6._8_56_ = auVar9;
  local_e8 = vmovlpd_avx(auVar6._0_16_);
  NVar11 = Normalize<float>((Normal3<float> *)CONCAT44(fVar2,FVar12));
  local_f0 = NVar11.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar7._0_8_ = NVar11.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar7._8_56_ = auVar9;
  local_150._88_8_ = vmovlpd_avx(auVar7._0_16_);
  local_bc = (Tuple3<pbrt::Normal3,float>  [8])local_150._88_8_;
  local_b4 = local_f0;
  if ((in_RSI->reverseOrientation & 1U) != 0) {
    Tuple3<pbrt::Normal3,float>::operator*=(local_bc,-1);
  }
  this_00 = &local_150;
  Point2<float>::Point2((Point2<float> *)this_00);
  Interaction::Interaction
            ((Interaction *)CONCAT44(fVar2,FVar12),
             (Point3fi *)CONCAT44(FVar3,in_stack_fffffffffffffe38),(Normal3f *)t,time,
             (Point2f *)this_00);
  FVar3 = Area(in_RSI);
  local_150.optionalValue._80_4_ = 1.0 / FVar3;
  pstd::optional<pbrt::ShapeSample>::optional
            (this_00,(ShapeSample *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  return t;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<ShapeSample> Sample(const Point2f &u) const {
        Float z = Lerp(u[0], zMin, zMax);
        Float phi = u[1] * phiMax;
        // Compute cylinder sample position _pi_ and normal _n_ from $z$ and $\phi$
        Point3f pObj = Point3f(radius * std::cos(phi), radius * std::sin(phi), z);
        // Reproject _pObj_ to cylinder surface and compute _pObjError_
        Float hitRad = std::sqrt(pObj.x * pObj.x + pObj.y * pObj.y);
        pObj.x *= radius / hitRad;
        pObj.y *= radius / hitRad;
        Vector3f pObjError = gamma(3) * Abs(Vector3f(pObj.x, pObj.y, 0));

        Point3fi pi = (*renderFromObject)(Point3fi(pObj, pObjError));
        Normal3f n = Normalize((*renderFromObject)(Normal3f(pObj.x, pObj.y, 0)));
        if (reverseOrientation)
            n *= -1;

        return ShapeSample{Interaction(pi, n), 1 / Area()};
    }